

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O3

void __thiscall
ConfidentialTransactionContext_SequenceApiTestWithKey_Test::TestBody
          (ConfidentialTransactionContext_SequenceApiTestWithKey_Test *this)

{
  ByteData *pBVar1;
  ConfidentialAssetId *this_00;
  string **ppsVar2;
  pointer puVar3;
  bool bVar4;
  size_t sVar5;
  long lVar6;
  _func_int *p_Var7;
  char *in_R9;
  Amount AVar8;
  initializer_list<cfd::UtxoData> __l;
  AssertionResult gtest_ar_;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  Amount fee;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ElementsAddressFactory factory;
  ConfidentialTransactionContext txc;
  AssertionResult gtest_ar;
  ElementsConfidentialAddress address;
  UtxoData utxo2;
  UtxoData utxo1;
  ElementsConfidentialAddress asset_address;
  undefined1 local_1948 [32];
  Privkey local_1928;
  undefined1 local_1908 [32];
  ByteData local_18e8;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_18c8;
  Pubkey local_18b0;
  Amount local_1898;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  local_1888;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1868;
  SigHashType local_1850;
  SigHashType local_1844;
  AddressFactory local_1838;
  ConfidentialTransactionContext local_1810;
  undefined1 local_1758 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_1750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1748;
  uchar local_1738 [16];
  pointer local_1728;
  pointer local_1710;
  pointer local_16f8;
  TapBranch local_16e0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1668;
  Script local_1650;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1610 [19];
  UtxoData local_1268;
  ElementsConfidentialAddress local_d70;
  UtxoData local_bc0;
  UtxoData local_6d0;
  ElementsConfidentialAddress local_1e0;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_1838,kElementsRegtest);
  cfd::UtxoData::UtxoData(&local_6d0);
  local_6d0.block_height = 0;
  local_6d0.binary_data = (void *)0x0;
  pBVar1 = &local_bc0.block_hash.data_;
  local_bc0.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_bc0,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1758,(string *)&local_bc0);
  cfd::core::Txid::operator=(&local_6d0.txid,(Txid *)local_1758);
  local_1758 = (undefined1  [8])&PTR__Txid_00723450;
  if (sStack_1750.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_1750.ptr_);
  }
  if ((ByteData *)local_bc0.block_height != pBVar1) {
    operator_delete((void *)local_bc0.block_height);
  }
  local_6d0.vout = 0;
  local_bc0.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_bc0,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)local_1758,(string *)&local_bc0);
  cfd::core::Script::operator=(&local_6d0.locking_script,(Script *)local_1758);
  cfd::core::Script::~Script((Script *)local_1758);
  if ((ByteData *)local_bc0.block_height != pBVar1) {
    operator_delete((void *)local_bc0.block_height);
  }
  local_bc0.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_bc0,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph","");
  cfd::AddressFactory::GetAddress((Address *)local_1758,&local_1838,(string *)&local_bc0);
  cfd::core::Address::operator=(&local_6d0.address,(Address *)local_1758);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1610);
  cfd::core::Script::~Script(&local_1650);
  local_16e0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1668)
  ;
  cfd::core::TapBranch::~TapBranch(&local_16e0);
  if (local_16f8 != (pointer)0x0) {
    operator_delete(local_16f8);
  }
  if (local_1710 != (pointer)0x0) {
    operator_delete(local_1710);
  }
  if (local_1728 != (pointer)0x0) {
    operator_delete(local_1728);
  }
  if ((uchar *)local_1748._M_allocated_capacity != local_1738) {
    operator_delete((void *)local_1748._M_allocated_capacity);
  }
  if ((ByteData *)local_bc0.block_height != pBVar1) {
    operator_delete((void *)local_bc0.block_height);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_6d0.descriptor,0,(char *)local_6d0.descriptor._M_string_length,0x57cab2);
  cfd::core::Amount::Amount((Amount *)local_1758,10000000);
  local_6d0.amount.ignore_check_ = sStack_1750.ptr_._0_1_;
  local_6d0.amount.amount_ = (int64_t)local_1758;
  local_6d0.address_type = kP2pkhAddress;
  local_bc0.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_bc0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1758,(string *)&local_bc0);
  this_00 = &local_6d0.asset;
  cfd::core::ConfidentialAssetId::operator=(this_00,(ConfidentialAssetId *)local_1758);
  local_1758 = (undefined1  [8])&PTR__ConfidentialAssetId_00723760;
  if (sStack_1750.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_1750.ptr_);
  }
  if ((ByteData *)local_bc0.block_height != pBVar1) {
    operator_delete((void *)local_bc0.block_height);
  }
  cfd::UtxoData::UtxoData(&local_bc0);
  local_bc0.block_height = 0;
  local_bc0.binary_data = (void *)0x0;
  ppsVar2 = (string **)((long)&local_d70 + 0x10);
  local_d70.unblinded_address_._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d70,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1758,(string *)&local_d70);
  cfd::core::Txid::operator=(&local_bc0.txid,(Txid *)local_1758);
  local_1758 = (undefined1  [8])&PTR__Txid_00723450;
  if (sStack_1750.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_1750.ptr_);
  }
  if ((string **)local_d70.unblinded_address_._0_8_ != ppsVar2) {
    operator_delete((void *)local_d70.unblinded_address_._0_8_);
  }
  local_bc0.vout = 0;
  local_d70.unblinded_address_._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d70,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)local_1758,(string *)&local_d70);
  cfd::core::Script::operator=(&local_bc0.locking_script,(Script *)local_1758);
  cfd::core::Script::~Script((Script *)local_1758);
  if ((string **)local_d70.unblinded_address_._0_8_ != ppsVar2) {
    operator_delete((void *)local_d70.unblinded_address_._0_8_);
  }
  local_d70.unblinded_address_._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d70,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE","");
  cfd::AddressFactory::GetAddress((Address *)local_1758,&local_1838,(string *)&local_d70);
  cfd::core::Address::operator=(&local_bc0.address,(Address *)local_1758);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1610);
  cfd::core::Script::~Script(&local_1650);
  local_16e0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1668)
  ;
  cfd::core::TapBranch::~TapBranch(&local_16e0);
  if (local_16f8 != (pointer)0x0) {
    operator_delete(local_16f8);
  }
  if (local_1710 != (pointer)0x0) {
    operator_delete(local_1710);
  }
  if (local_1728 != (pointer)0x0) {
    operator_delete(local_1728);
  }
  if ((uchar *)local_1748._M_allocated_capacity != local_1738) {
    operator_delete((void *)local_1748._M_allocated_capacity);
  }
  if ((string **)local_d70.unblinded_address_._0_8_ != ppsVar2) {
    operator_delete((void *)local_d70.unblinded_address_._0_8_);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_bc0.descriptor,0,(char *)local_bc0.descriptor._M_string_length,0x542123);
  cfd::core::Amount::Amount((Amount *)local_1758,180000);
  local_bc0.amount.ignore_check_ = sStack_1750.ptr_._0_1_;
  local_bc0.amount.amount_ = (int64_t)local_1758;
  local_bc0.address_type = kP2shP2wpkhAddress;
  local_d70.unblinded_address_._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d70,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1758,(string *)&local_d70);
  cfd::core::ConfidentialAssetId::operator=(&local_bc0.asset,(ConfidentialAssetId *)local_1758);
  local_1758 = (undefined1  [8])&PTR__ConfidentialAssetId_00723760;
  if (sStack_1750.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_1750.ptr_);
  }
  if ((string **)local_d70.unblinded_address_._0_8_ != ppsVar2) {
    operator_delete((void *)local_d70.unblinded_address_._0_8_);
  }
  local_d70.unblinded_address_._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d70,"23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e"
             ,"");
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_1758,(string *)&local_d70);
  cfd::core::BlindFactor::operator=(&local_bc0.asset_blind_factor,(BlindFactor *)local_1758);
  local_1758 = (undefined1  [8])&PTR__BlindFactor_00723500;
  if (sStack_1750.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_1750.ptr_);
  }
  if ((string **)local_d70.unblinded_address_._0_8_ != ppsVar2) {
    operator_delete((void *)local_d70.unblinded_address_._0_8_);
  }
  local_d70.unblinded_address_._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d70,"6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc"
             ,"");
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_1758,(string *)&local_d70);
  cfd::core::BlindFactor::operator=(&local_bc0.amount_blind_factor,(BlindFactor *)local_1758);
  local_1758 = (undefined1  [8])&PTR__BlindFactor_00723500;
  if (sStack_1750.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_1750.ptr_);
  }
  if ((string **)local_d70.unblinded_address_._0_8_ != ppsVar2) {
    operator_delete((void *)local_d70.unblinded_address_._0_8_);
  }
  local_d70.unblinded_address_._0_8_ = ppsVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d70,
             "09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa","");
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_1758,(string *)&local_d70);
  cfd::core::ConfidentialValue::operator=
            (&local_bc0.value_commitment,(ConfidentialValue *)local_1758);
  local_1758 = (undefined1  [8])&PTR__ConfidentialValue_00723840;
  if (sStack_1750.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_1750.ptr_);
  }
  if ((string **)local_d70.unblinded_address_._0_8_ != ppsVar2) {
    operator_delete((void *)local_d70.unblinded_address_._0_8_);
  }
  local_1758 = (undefined1  [8])&local_1748;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1758,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz","");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_d70,(string *)local_1758);
  if (local_1758 != (undefined1  [8])&local_1748) {
    operator_delete((void *)local_1758);
  }
  local_1758 = (undefined1  [8])&local_1748;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1758,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS","");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_1e0,(string *)local_1758);
  if (local_1758 != (undefined1  [8])&local_1748) {
    operator_delete((void *)local_1758);
  }
  cfd::core::Amount::Amount(&local_1898,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&local_1810,2,0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::ConfidentialTransactionContext::AddInput(&local_1810,&local_6d0);
    }
  }
  else {
    testing::Message::Message((Message *)local_1758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x2ff,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1948,(Message *)local_1758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1948);
    if (((local_1758 != (undefined1  [8])0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4))
       && (local_1758 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_1758 + 8))();
    }
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)local_1758,&local_bc0.txid,local_bc0.vout);
  cfd::ConfidentialTransactionContext::AddTxIn(&local_1810,(OutPoint *)local_1758);
  local_1758 = (undefined1  [8])&PTR__Txid_00723450;
  if (sStack_1750.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_1750.ptr_);
  }
  AVar8 = cfd::core::operator-(&local_6d0.amount,&local_1898);
  local_1758 = (undefined1  [8])AVar8.amount_;
  sStack_1750.ptr_._0_1_ = AVar8.ignore_check_;
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_1810,&local_d70,(Amount *)local_1758,this_00,false);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress((Address *)local_1758,&local_1e0);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_1810,(Address *)local_1758,&local_bc0.amount,&local_bc0.asset);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1610);
  cfd::core::Script::~Script(&local_1650);
  local_16e0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1668)
  ;
  cfd::core::TapBranch::~TapBranch(&local_16e0);
  if (local_16f8 != (pointer)0x0) {
    operator_delete(local_16f8);
  }
  if (local_1710 != (pointer)0x0) {
    operator_delete(local_1710);
  }
  if (local_1728 != (pointer)0x0) {
    operator_delete(local_1728);
  }
  if ((uchar *)local_1748._M_allocated_capacity != local_1738) {
    operator_delete((void *)local_1748._M_allocated_capacity);
  }
  cfd::core::ConfidentialTransaction::AddTxOutFee
            (&local_1810.super_ConfidentialTransaction,&local_1898,this_00);
  cfd::UtxoData::UtxoData((UtxoData *)local_1758,&local_6d0);
  cfd::UtxoData::UtxoData(&local_1268,&local_bc0);
  __l._M_len = 2;
  __l._M_array = (iterator)local_1758;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_1868,__l,(allocator_type *)local_1948);
  lVar6 = 0x4f0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_1758 + lVar6));
    lVar6 = lVar6 + -0x4f0;
  } while (lVar6 != -0x4f0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo(&local_1810,&local_1868);
    }
  }
  else {
    testing::Message::Message((Message *)local_1758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x306,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1948,(Message *)local_1758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1948);
    if (((local_1758 != (undefined1  [8])0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4))
       && (local_1758 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_1758 + 8))();
    }
  }
  local_1888.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1888.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1888.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1888,&local_1e0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      in_R9 = (char *)0x0;
      cfd::ConfidentialTransactionContext::Blind
                (&local_1810,&local_1888,1,0,0x34,
                 (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)local_1758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x30a,
               "Expected: txc.Blind(&ct_addrs) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1948,(Message *)local_1758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1948);
    if (((local_1758 != (undefined1  [8])0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4))
       && (local_1758 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_1758 + 8))();
    }
  }
  cfd::core::ConfidentialTransaction::GetTxOutList
            (&local_18c8,&local_1810.super_ConfidentialTransaction);
  local_1948._0_8_ =
       ((long)local_18c8.
              super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_18c8.
              super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1084210842108421;
  local_1928.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1758,"txouts.size()","3",(unsigned_long *)local_1948,
             (int *)&local_1928);
  if (local_1758[0] == (string)0x0) {
    testing::Message::Message((Message *)local_1948);
    if (sStack_1750.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      p_Var7 = (_func_int *)0x6169ca;
    }
    else {
      p_Var7 = (_func_int *)((sStack_1750.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1928,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x30c,(char *)p_Var7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1928,(Message *)local_1948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1928);
    if ((((AssertHelperData *)local_1948._0_8_ != (AssertHelperData *)0x0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((AssertHelperData *)local_1948._0_8_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_1948._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_1750,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((long)local_18c8.
            super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_18c8.
            super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x2e8) goto LAB_001ef420;
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_1758,
             &(local_18c8.
               super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_start)->confidential_value_);
  bVar4 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)local_1758);
  local_1948[0] = bVar4;
  local_1948._8_8_ = 0;
  local_1758 = (undefined1  [8])&PTR__ConfidentialValue_00723840;
  if (sStack_1750.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    if (!bVar4) goto LAB_001ef14e;
  }
  else {
    operator_delete(sStack_1750.ptr_);
    if ((local_1948._0_8_ & 1) == 0) {
LAB_001ef14e:
      testing::Message::Message((Message *)&local_1928);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1758,(internal *)local_1948,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1908,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x30e,(char *)local_1758);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1908,(Message *)&local_1928);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1908);
      if (local_1758 != (undefined1  [8])&local_1748) {
        operator_delete((void *)local_1758);
      }
      if (((CONCAT44(local_1928.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     local_1928.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
         ((long *)CONCAT44(local_1928.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_1928.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_1928.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_1928.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1948 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_1758,
             &local_18c8.
              super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_start[1].confidential_value_);
  bVar4 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)local_1758);
  local_1948[0] = bVar4;
  local_1948._8_8_ = 0;
  local_1758 = (undefined1  [8])&PTR__ConfidentialValue_00723840;
  if (sStack_1750.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    if (!bVar4) goto LAB_001ef25d;
  }
  else {
    operator_delete(sStack_1750.ptr_);
    if ((local_1948._0_8_ & 1) == 0) {
LAB_001ef25d:
      testing::Message::Message((Message *)&local_1928);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1758,(internal *)local_1948,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1908,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x30f,(char *)local_1758);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1908,(Message *)&local_1928);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1908);
      if (local_1758 != (undefined1  [8])&local_1748) {
        operator_delete((void *)local_1758);
      }
      if (((CONCAT44(local_1928.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     local_1928.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
         ((long *)CONCAT44(local_1928.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_1928.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_1928.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_1928.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1948 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_1758,
             &local_18c8.
              super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_start[2].confidential_value_);
  bVar4 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)local_1758);
  local_1948[0] = !bVar4;
  local_1948._8_8_ = 0;
  local_1758 = (undefined1  [8])&PTR__ConfidentialValue_00723840;
  if (sStack_1750.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    if (bVar4) goto LAB_001ef371;
  }
  else {
    operator_delete(sStack_1750.ptr_);
    if ((local_1948._0_8_ & 1) == 0) {
LAB_001ef371:
      testing::Message::Message((Message *)&local_1928);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1758,(internal *)local_1948,
                 (AssertionResult *)"txouts[2].GetConfidentialValue().HasBlinding()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1908,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x310,(char *)local_1758);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1908,(Message *)&local_1928);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1908);
      if (local_1758 != (undefined1  [8])&local_1748) {
        operator_delete((void *)local_1758);
      }
      if (((CONCAT44(local_1928.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     local_1928.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
         ((long *)CONCAT44(local_1928.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_1928.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_1928.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_1928.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1948 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
LAB_001ef420:
  cfd::core::ByteData::ByteData(&local_18e8);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_1758,&local_6d0.txid,local_6d0.vout);
      local_1948._0_8_ = (AssertHelperData *)(local_1948 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1948,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_18b0,(string *)local_1948);
      local_1908._0_8_ = (AssertHelperData *)(local_1908 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1908,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_1928,(string *)local_1908,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_1844);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&local_1810,(OutPoint *)local_1758,&local_18b0,&local_1928,&local_1844,true);
      if ((void *)CONCAT44(local_1928.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_1928.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_1928.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_1928.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      if ((AssertHelperData *)local_1908._0_8_ != (AssertHelperData *)(local_1908 + 0x10)) {
        operator_delete((void *)local_1908._0_8_);
      }
      if (local_18b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_18b0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((AssertHelperData *)local_1948._0_8_ != (AssertHelperData *)(local_1948 + 0x10)) {
        operator_delete((void *)local_1948._0_8_);
      }
      local_1758 = (undefined1  [8])&PTR__Txid_00723450;
      if (sStack_1750.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_1750.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x318,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1948,(Message *)local_1758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1948);
    if (((local_1758 != (undefined1  [8])0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4))
       && (local_1758 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_1758 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_1758,&local_6d0.txid,local_6d0.vout);
      cfd::ConfidentialTransactionContext::Verify(&local_1810,(OutPoint *)local_1758);
      local_1758 = (undefined1  [8])&PTR__Txid_00723450;
      if (sStack_1750.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_1750.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x319,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1948,(Message *)local_1758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1948);
    if (((local_1758 != (undefined1  [8])0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4))
       && (local_1758 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_1758 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::ConfidentialTransactionContext::Finalize((ByteData *)local_1758,&local_1810);
    puVar3 = local_18e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_18e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1758;
    local_18e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)sStack_1750.ptr_;
    local_18e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1748._M_allocated_capacity;
    local_1758 = (undefined1  [8])0x0;
    sStack_1750.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1748._M_allocated_capacity = 0;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)puVar3 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) && (operator_delete(puVar3), local_1758 != (undefined1  [8])0x0)) {
      operator_delete((void *)local_1758);
    }
  }
  testing::Message::Message((Message *)local_1758);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_1948,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x31b,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_1948,(Message *)local_1758);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1948);
  if (((local_1758 != (undefined1  [8])0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
     (local_1758 != (undefined1  [8])0x0)) {
    (**(code **)(*(size_type *)local_1758 + 8))();
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_1758,&local_bc0.txid,local_bc0.vout);
      local_1948._0_8_ = (AssertHelperData *)(local_1948 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1948,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_18b0,(string *)local_1948);
      local_1908._0_8_ = (AssertHelperData *)(local_1908 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1908,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif(&local_1928,(string *)local_1908,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_1850);
      cfd::ConfidentialTransactionContext::SignWithKey
                (&local_1810,(OutPoint *)local_1758,&local_18b0,&local_1928,&local_1850,true);
      if ((void *)CONCAT44(local_1928.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_1928.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_1928.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_1928.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      if ((AssertHelperData *)local_1908._0_8_ != (AssertHelperData *)(local_1908 + 0x10)) {
        operator_delete((void *)local_1908._0_8_);
      }
      if (local_18b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_18b0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((AssertHelperData *)local_1948._0_8_ != (AssertHelperData *)(local_1948 + 0x10)) {
        operator_delete((void *)local_1948._0_8_);
      }
      local_1758 = (undefined1  [8])&PTR__Txid_00723450;
      if (sStack_1750.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_1750.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,800,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1948,(Message *)local_1758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1948);
    if (((local_1758 != (undefined1  [8])0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4))
       && (local_1758 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_1758 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_1758,&local_bc0.txid,local_bc0.vout);
      cfd::ConfidentialTransactionContext::Verify(&local_1810,(OutPoint *)local_1758);
      local_1758 = (undefined1  [8])&PTR__Txid_00723450;
      if (sStack_1750.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_1750.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x321,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1948,(Message *)local_1758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1948);
    if (((local_1758 != (undefined1  [8])0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4))
       && (local_1758 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_1758 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::ConfidentialTransactionContext::Finalize((ByteData *)local_1758,&local_1810);
      puVar3 = local_18e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_18e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1758;
      local_18e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)sStack_1750.ptr_;
      local_18e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1748._M_allocated_capacity;
      local_1758 = (undefined1  [8])0x0;
      sStack_1750.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1748._M_allocated_capacity = 0;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)puVar3 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) && (operator_delete(puVar3), local_1758 != (undefined1  [8])0x0)) {
        operator_delete((void *)local_1758);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x322,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1948,(Message *)local_1758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1948);
    if (((local_1758 != (undefined1  [8])0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4))
       && (local_1758 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_1758 + 8))();
    }
  }
  sVar5 = cfd::core::ByteData::GetDataSize(&local_18e8);
  if (((sVar5 != 0x23e1) && (sVar5 = cfd::core::ByteData::GetDataSize(&local_18e8), sVar5 != 0x23e2)
      ) && (sVar5 = cfd::core::ByteData::GetDataSize(&local_18e8), sVar5 != 0x23e3)) {
    local_1928.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0;
    local_1948._0_8_ = cfd::core::ByteData::GetDataSize(&local_18e8);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_1758,"0","tx.GetDataSize()",(int *)&local_1928,
               (unsigned_long *)local_1948);
    if (local_1758[0] == (string)0x0) {
      testing::Message::Message((Message *)local_1948);
      if (sStack_1750.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        p_Var7 = (_func_int *)0x6169ca;
      }
      else {
        p_Var7 = (_func_int *)((sStack_1750.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1928,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x325,(char *)p_Var7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1928,(Message *)local_1948);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1928);
      if ((((AssertHelperData *)local_1948._0_8_ != (AssertHelperData *)0x0) &&
          (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
         ((AssertHelperData *)local_1948._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1948._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_1750,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_18e8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&local_18c8);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&local_1888);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_1868);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_1810);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_1e0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_d70);
  cfd::UtxoData::~UtxoData(&local_bc0);
  cfd::UtxoData::~UtxoData(&local_6d0);
  local_1838._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_1838.prefix_list_);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SequenceApiTestWithKey)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.asset_blind_factor = BlindFactor("");
  // utxo1.amount_blind_factor = BlindFactor("");
  // utxo1.value_commitment = ConfidentialValue("");

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // blinding key: '66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  // utxo2.confidential_address;
  utxo2.asset_blind_factor = BlindFactor("23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e");
  utxo2.amount_blind_factor = BlindFactor("6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc");
  utxo2.value_commitment = ConfidentialValue("09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxOut(address, utxo1.amount - fee, utxo1.asset);
  txc.AddTxOut(asset_address.GetUnblindedAddress(), utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(fee, utxo1.asset);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  ct_addrs.push_back(asset_address);
  EXPECT_NO_THROW(txc.Blind(&ct_addrs));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 3);
  if (txouts.size() == 3) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[2].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 9185) && (tx.GetDataSize() != 9186) && (tx.GetDataSize() != 9187)) {
    EXPECT_EQ(0, tx.GetDataSize());
  }
}